

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void rapidjson::internal::
     Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
     ::AssignIfExist(SizeType *out,ValueType *value,ValueType *name)

{
  bool bVar1;
  ValueType *this;
  uint64_t uVar2;
  ValueType *v;
  ValueType *name_local;
  ValueType *value_local;
  SizeType *out_local;
  
  this = GetMember(value,name);
  if (((this != (ValueType *)0x0) &&
      (bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::IsUint64(this), bVar1)) &&
     (uVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint64(this), uVar2 < 0x100000000)) {
    uVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint64(this);
    *out = (SizeType)uVar2;
  }
  return;
}

Assistant:

static void AssignIfExist(SizeType& out, const ValueType& value, const ValueType& name) {
        if (const ValueType* v = GetMember(value, name))
            if (v->IsUint64() && v->GetUint64() <= SizeType(~0))
                out = static_cast<SizeType>(v->GetUint64());
    }